

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite_demovfs.c
# Opt level: O0

int demoFileSize(unqlite_file *pFile,unqlite_int64 *pSize)

{
  int iVar1;
  undefined1 local_c0 [8];
  stat sStat;
  int rc;
  DemoFile *p;
  unqlite_int64 *pSize_local;
  unqlite_file *pFile_local;
  
  sStat.__glibc_reserved[2]._4_4_ = demoFlushBuffer((DemoFile *)pFile);
  pFile_local._4_4_ = sStat.__glibc_reserved[2]._4_4_;
  if (sStat.__glibc_reserved[2]._4_4_ == 0) {
    iVar1 = fstat(*(int *)&pFile[2].pMethods,(stat *)local_c0);
    if (iVar1 == 0) {
      *pSize = sStat.st_rdev;
      pFile_local._4_4_ = 0;
    }
    else {
      pFile_local._4_4_ = -2;
    }
  }
  return pFile_local._4_4_;
}

Assistant:

static int demoFileSize(unqlite_file *pFile, unqlite_int64 *pSize){
  DemoFile *p = (DemoFile*)pFile;
  int rc;                         /* Return code from fstat() call */
  struct stat sStat;              /* Output of fstat() call */

  /* Flush the contents of the buffer to disk. As with the flush in the
  ** demoRead() method, it would be possible to avoid this and save a write
  ** here and there. But in practice this comes up so infrequently it is
  ** not worth the trouble.
  */
  rc = demoFlushBuffer(p);
  if( rc!=UNQLITE_OK ){
    return rc;
  }

  rc = fstat(p->fd, &sStat);
  if( rc!=0 ) return UNQLITE_IOERR;
  *pSize = sStat.st_size;
  return UNQLITE_OK;
}